

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O1

qint64 __thiscall
QFSFileEnginePrivate::readLineFdFh(QFSFileEnginePrivate *this,char *data,qint64 maxlen)

{
  QAbstractFileEngine *this_00;
  int iVar1;
  __off64_t _Var2;
  char *pcVar3;
  __off64_t _Var4;
  size_t sVar5;
  int *piVar6;
  qint64 qVar7;
  long in_FS_OFFSET;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QAbstractFileEnginePrivate).q_ptr;
  if ((FILE *)this->fh == (FILE *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      qVar7 = QAbstractFileEngine::readLine(this_00,data,maxlen);
      return qVar7;
    }
  }
  else {
    _Var2 = ftello64((FILE *)this->fh);
    pcVar3 = fgets(data,(int)maxlen + 1,(FILE *)this->fh);
    if (pcVar3 == (char *)0x0) {
      iVar1 = feof((FILE *)this->fh);
      qVar7 = -1;
      if (iVar1 == 0) {
        piVar6 = __errno_location();
        QSystemError::stdString(&local_48,*piVar6);
        QAbstractFileEngine::setError(this_00,ReadError,&local_48);
        if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
    }
    else {
      _Var4 = ftello64((FILE *)this->fh);
      qVar7 = _Var4 - _Var2;
      if (qVar7 == 0 || _Var4 < _Var2) {
        if (data != (char *)0x0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
            sVar5 = strlen(data);
            return sVar5;
          }
          goto LAB_0011b698;
        }
        qVar7 = 0;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return qVar7;
    }
  }
LAB_0011b698:
  __stack_chk_fail();
}

Assistant:

qint64 QFSFileEnginePrivate::readLineFdFh(char *data, qint64 maxlen)
{
    Q_Q(QFSFileEngine);
    if (!fh)
        return q->QAbstractFileEngine::readLine(data, maxlen);

    QT_OFF_T oldPos = 0;
#ifdef Q_OS_WIN
    bool seq = q->isSequential();
    if (!seq)
#endif
        oldPos = QT_FTELL(fh);

    // QIODevice::readLine() passes maxlen - 1 to QFile::readLineData()
    // because it has made space for the '\0' at the end of data.  But fgets
    // does the same, so we'd get two '\0' at the end - passing maxlen + 1
    // solves this.
    if (!fgets(data, int(maxlen + 1), fh)) {
        if (!feof(fh)) // Doesn't change errno
            q->setError(QFile::ReadError, QSystemError::stdString(errno));
        return -1;              // error
    }

#ifdef Q_OS_WIN
    if (seq)
        return qstrlen(data);
#endif

    qint64 lineLength = QT_FTELL(fh) - oldPos;
    return lineLength > 0 ? lineLength : qstrlen(data);
}